

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

string * __thiscall
BasePort::ProtocolString_abi_cxx11_
          (string *__return_storage_ptr__,BasePort *this,ProtocolType protocol)

{
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  ProtocolType protocol_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"sequential-read-write",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"sequential-read-broadcast-write",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else if (local_14 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"broadcast-query-read-write",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown",&local_27);
    std::allocator<char>::~allocator(&local_27);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BasePort::ProtocolString(ProtocolType protocol)
{
    if (protocol == PROTOCOL_SEQ_RW) {
        return std::string("sequential-read-write");
    } else if (protocol == PROTOCOL_SEQ_R_BC_W) {
        return std::string("sequential-read-broadcast-write");
    } else if (protocol == PROTOCOL_BC_QRW) {
        return std::string("broadcast-query-read-write");
    }
    return std::string("Unknown");
}